

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O3

QString * FileHdrWrapper::translateMachine(DWORD val)

{
  Data *pDVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_color in_ESI;
  QString *in_RDI;
  bool bVar5;
  QByteArrayView QVar6;
  key_type_conflict2 local_3c;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  if (s_machine._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    initMachine();
  }
  if (s_machine._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &s_machine._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = s_machine._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      bVar5 = p_Var4[1]._M_color < in_ESI;
      if (!bVar5) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar5];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != &s_machine._M_t._M_impl.super__Rb_tree_header) &&
       (p_Var2[1]._M_color <= in_ESI)) {
      pmVar3 = std::
               map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
               ::operator[](&s_machine,&local_3c);
      pDVar1 = (pmVar3->d).d;
      (in_RDI->d).d = pDVar1;
      (in_RDI->d).ptr = (pmVar3->d).ptr;
      (in_RDI->d).size = (pmVar3->d).size;
      if (pDVar1 == (Data *)0x0) {
        return in_RDI;
      }
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return in_RDI;
    }
  }
  QVar6.m_data = (storage_type *)0x0;
  QVar6.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar6);
  (in_RDI->d).d = local_38;
  (in_RDI->d).ptr = pcStack_30;
  (in_RDI->d).size = local_28;
  return in_RDI;
}

Assistant:

QString FileHdrWrapper::translateMachine(DWORD val)
{
    if (s_machine.size() == 0) 
        initMachine();

    if (s_machine.find(val) == s_machine.end()) return "";
    return s_machine[val];
}